

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O3

bool __thiscall
rapidjson::internal::BigInteger::Difference(BigInteger *this,BigInteger *rhs,BigInteger *out)

{
  long lVar1;
  BigInteger *pBVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = this->count_;
  bVar6 = uVar3 < rhs->count_;
  if (uVar3 == rhs->count_) {
    do {
      if (uVar3 == 0) {
        __assert_fail("cmp != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/biginteger.h"
                      ,0xbc,
                      "bool rapidjson::internal::BigInteger::Difference(const BigInteger &, BigInteger *) const"
                     );
      }
      lVar4 = uVar3 - 1;
      lVar1 = uVar3 - 1;
      bVar6 = this->digits_[lVar1] < rhs->digits_[lVar4];
      uVar3 = uVar3 - 1;
    } while (this->digits_[lVar1] == rhs->digits_[lVar4]);
  }
  pBVar2 = rhs;
  if (bVar6 != false) {
    pBVar2 = this;
    this = rhs;
  }
  if (this->count_ != 0) {
    uVar3 = 0;
    lVar4 = 0;
    do {
      uVar5 = lVar4 + this->digits_[uVar3];
      if (uVar3 < pBVar2->count_) {
        uVar5 = uVar5 - pBVar2->digits_[uVar3];
      }
      lVar4 = -(ulong)(this->digits_[uVar3] < uVar5);
      out->digits_[uVar3] = uVar5;
      uVar3 = uVar3 + 1;
      if (uVar5 != 0) {
        out->count_ = uVar3;
      }
    } while (uVar3 < this->count_);
  }
  return bVar6;
}

Assistant:

bool Difference(const BigInteger& rhs, BigInteger* out) const {
        int cmp = Compare(rhs);
        RAPIDJSON_ASSERT(cmp != 0);
        const BigInteger *a, *b;  // Makes a > b
        bool ret;
        if (cmp < 0) { a = &rhs; b = this; ret = true; }
        else         { a = this; b = &rhs; ret = false; }

        Type borrow = 0;
        for (size_t i = 0; i < a->count_; i++) {
            Type d = a->digits_[i] - borrow;
            if (i < b->count_)
                d -= b->digits_[i];
            borrow = (d > a->digits_[i]) ? 1 : 0;
            out->digits_[i] = d;
            if (d != 0)
                out->count_ = i + 1;
        }

        return ret;
    }